

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNLinearSolver SUNLinSol_SPBCGS(N_Vector y,int pretype,int maxl)

{
  _generic_N_Vector_Ops *__ptr;
  int *piVar1;
  N_Vector p_Var2;
  SUNLinearSolverContent_SPBCGS content;
  SUNLinearSolver_Ops ops;
  SUNLinearSolver S;
  int maxl_local;
  int pretype_local;
  N_Vector y_local;
  
  S._4_4_ = pretype;
  if ((((pretype != 0) && (pretype != 1)) && (pretype != 2)) && (pretype != 3)) {
    S._4_4_ = 0;
  }
  S._0_4_ = maxl;
  if (maxl < 1) {
    S._0_4_ = 5;
  }
  if (((((y->ops->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
        (y->ops->nvdestroy == (_func_void_N_Vector *)0x0)) ||
       ((y->ops->nvlinearsum == (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0 ||
        ((y->ops->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0 ||
         (y->ops->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0)))))) ||
      (y->ops->nvscale == (_func_void_realtype_N_Vector_N_Vector *)0x0)) ||
     (y->ops->nvdotprod == (_func_realtype_N_Vector_N_Vector *)0x0)) {
    y_local = (N_Vector)0x0;
  }
  else {
    y_local = (N_Vector)malloc(0x10);
    if (y_local == (N_Vector)0x0) {
      y_local = (N_Vector)0x0;
    }
    else {
      __ptr = (_generic_N_Vector_Ops *)malloc(0x68);
      if (__ptr == (_generic_N_Vector_Ops *)0x0) {
        free(y_local);
        y_local = (N_Vector)0x0;
      }
      else {
        __ptr->nvgetvectorid = SUNLinSolGetType_SPBCGS;
        __ptr->nvclone = SUNLinSolSetATimes_SPBCGS;
        __ptr->nvcloneempty = SUNLinSolSetPreconditioner_SPBCGS;
        __ptr->nvdestroy = SUNLinSolSetScalingVectors_SPBCGS;
        __ptr->nvspace = SUNLinSolInitialize_SPBCGS;
        __ptr->nvgetarraypointer = SUNLinSolSetup_SPBCGS;
        __ptr->nvsetarraypointer = SUNLinSolSolve_SPBCGS;
        __ptr->nvlinearsum = SUNLinSolNumIters_SPBCGS;
        __ptr->nvconst = SUNLinSolResNorm_SPBCGS;
        __ptr->nvscale = SUNLinSolResid_SPBCGS;
        __ptr->nvprod = SUNLinSolLastFlag_SPBCGS;
        __ptr->nvdiv = SUNLinSolSpace_SPBCGS;
        __ptr->nvabs = SUNLinSolFree_SPBCGS;
        piVar1 = (int *)malloc(0x90);
        if (piVar1 == (int *)0x0) {
          free(__ptr);
          free(y_local);
          y_local = (N_Vector)0x0;
        }
        else {
          piVar1[6] = 0;
          piVar1[7] = 0;
          *piVar1 = (int)S;
          piVar1[1] = S._4_4_;
          piVar1[2] = 0;
          piVar1[4] = 0;
          piVar1[5] = 0;
          p_Var2 = N_VClone(y);
          *(N_Vector *)(piVar1 + 0x18) = p_Var2;
          if (*(long *)(piVar1 + 0x18) == 0) {
            y_local = (N_Vector)0x0;
          }
          else {
            p_Var2 = N_VClone(y);
            *(N_Vector *)(piVar1 + 0x16) = p_Var2;
            if (*(long *)(piVar1 + 0x16) == 0) {
              y_local = (N_Vector)0x0;
            }
            else {
              p_Var2 = N_VClone(y);
              *(N_Vector *)(piVar1 + 0x1a) = p_Var2;
              if (*(long *)(piVar1 + 0x1a) == 0) {
                y_local = (N_Vector)0x0;
              }
              else {
                p_Var2 = N_VClone(y);
                *(N_Vector *)(piVar1 + 0x1c) = p_Var2;
                if (*(long *)(piVar1 + 0x1c) == 0) {
                  y_local = (N_Vector)0x0;
                }
                else {
                  p_Var2 = N_VClone(y);
                  *(N_Vector *)(piVar1 + 0x1e) = p_Var2;
                  if (*(long *)(piVar1 + 0x1e) == 0) {
                    y_local = (N_Vector)0x0;
                  }
                  else {
                    p_Var2 = N_VClone(y);
                    *(N_Vector *)(piVar1 + 0x20) = p_Var2;
                    if (*(long *)(piVar1 + 0x20) == 0) {
                      y_local = (N_Vector)0x0;
                    }
                    else {
                      p_Var2 = N_VClone(y);
                      *(N_Vector *)(piVar1 + 0x22) = p_Var2;
                      if (*(long *)(piVar1 + 0x22) == 0) {
                        y_local = (N_Vector)0x0;
                      }
                      else {
                        piVar1[0x12] = 0;
                        piVar1[0x13] = 0;
                        piVar1[0x14] = 0;
                        piVar1[0x15] = 0;
                        piVar1[8] = 0;
                        piVar1[9] = 0;
                        piVar1[10] = 0;
                        piVar1[0xb] = 0;
                        piVar1[0xc] = 0;
                        piVar1[0xd] = 0;
                        piVar1[0xe] = 0;
                        piVar1[0xf] = 0;
                        piVar1[0x10] = 0;
                        piVar1[0x11] = 0;
                        y_local->content = piVar1;
                        y_local->ops = __ptr;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (SUNLinearSolver)y_local;
}

Assistant:

SUNLinearSolver SUNLinSol_SPBCGS(N_Vector y, int pretype, int maxl)
{
  SUNLinearSolver S;
  SUNLinearSolver_Ops ops;
  SUNLinearSolverContent_SPBCGS content;
  
  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != PREC_NONE)  && (pretype != PREC_LEFT) &&
      (pretype != PREC_RIGHT) && (pretype != PREC_BOTH))
    pretype = PREC_NONE;
  if (maxl <= 0)
    maxl = SUNSPBCGS_MAXL_DEFAULT;

  /* check that the supplied N_Vector supports all requisite operations */
  if ( (y->ops->nvclone == NULL) || (y->ops->nvdestroy == NULL) ||
       (y->ops->nvlinearsum == NULL) || (y->ops->nvprod == NULL) ||
       (y->ops->nvdiv == NULL) || (y->ops->nvscale == NULL) ||
       (y->ops->nvdotprod == NULL) )
    return(NULL);

  /* Create linear solver */
  S = NULL;
  S = (SUNLinearSolver) malloc(sizeof *S);
  if (S == NULL) return(NULL);
  
  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNLinearSolver_Ops) malloc(sizeof(struct _generic_SUNLinearSolver_Ops));
  if (ops == NULL) { free(S); return(NULL); }

  /* Attach operations */
  ops->gettype           = SUNLinSolGetType_SPBCGS;
  ops->setatimes         = SUNLinSolSetATimes_SPBCGS;
  ops->setpreconditioner = SUNLinSolSetPreconditioner_SPBCGS;
  ops->setscalingvectors = SUNLinSolSetScalingVectors_SPBCGS;
  ops->initialize        = SUNLinSolInitialize_SPBCGS;
  ops->setup             = SUNLinSolSetup_SPBCGS;
  ops->solve             = SUNLinSolSolve_SPBCGS;
  ops->numiters          = SUNLinSolNumIters_SPBCGS;
  ops->resnorm           = SUNLinSolResNorm_SPBCGS;
  ops->resid             = SUNLinSolResid_SPBCGS;
  ops->lastflag          = SUNLinSolLastFlag_SPBCGS;  
  ops->space             = SUNLinSolSpace_SPBCGS;  
  ops->free              = SUNLinSolFree_SPBCGS;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPBCGS) malloc(sizeof(struct _SUNLinearSolverContent_SPBCGS));
  if (content == NULL) { free(ops); free(S); return(NULL); }

  /* Fill content */
  content->last_flag = 0;
  content->maxl = maxl;
  content->pretype = pretype;
  content->numiters = 0;
  content->resnorm = ZERO;
  content->r_star = N_VClone(y);
  if (content->r_star == NULL)  return(NULL);
  content->r = N_VClone(y);
  if (content->r == NULL)  return(NULL);
  content->p = N_VClone(y);
  if (content->p == NULL)  return(NULL);
  content->q = N_VClone(y);
  if (content->q == NULL)  return(NULL);
  content->u = N_VClone(y);
  if (content->u == NULL)  return(NULL);
  content->Ap = N_VClone(y);
  if (content->Ap == NULL)  return(NULL);
  content->vtemp = N_VClone(y);
  if (content->vtemp == NULL)  return(NULL);
  content->s1 = NULL;
  content->s2 = NULL;
  content->ATimes = NULL;
  content->ATData = NULL;
  content->Psetup = NULL;
  content->Psolve = NULL;
  content->PData = NULL;

  /* Attach content and ops */
  S->content = content;
  S->ops     = ops;

  return(S);
}